

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::dump(APInt *this)

{
  raw_ostream *prVar1;
  size_t __n;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  SmallString<40U> S;
  SmallString<40U> U;
  SmallVectorImpl<char> local_98;
  undefined1 local_88 [40];
  SmallVectorImpl<char> local_60;
  undefined1 local_50 [40];
  
  local_98.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_98.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  local_98.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_88;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_50;
  toString(this,&local_60,10,false,false);
  __n = 1;
  toString(this,&local_98,10,true,false);
  prVar1 = dbgs();
  Str.Length = 6;
  Str.Data = "APInt(";
  prVar1 = raw_ostream::operator<<(prVar1,Str);
  prVar1 = raw_ostream::operator<<(prVar1,(ulong)this->BitWidth);
  Str_00.Length = 3;
  Str_00.Data = "b, ";
  prVar1 = raw_ostream::operator<<(prVar1,Str_00);
  prVar1 = (raw_ostream *)
           raw_ostream::write(prVar1,(int)local_60.super_SmallVectorTemplateBase<char,_true>.
                                          super_SmallVectorTemplateCommon<char,_void>.
                                          super_SmallVectorBase.BeginX,
                              (void *)(local_60.super_SmallVectorTemplateBase<char,_true>.
                                       super_SmallVectorTemplateCommon<char,_void>.
                                       super_SmallVectorBase._8_8_ & 0xffffffff),__n);
  Str_01.Length = 2;
  Str_01.Data = "u ";
  prVar1 = raw_ostream::operator<<(prVar1,Str_01);
  prVar1 = (raw_ostream *)
           raw_ostream::write(prVar1,(int)local_98.super_SmallVectorTemplateBase<char,_true>.
                                          super_SmallVectorTemplateCommon<char,_void>.
                                          super_SmallVectorBase.BeginX,
                              (void *)(local_98.super_SmallVectorTemplateBase<char,_true>.
                                       super_SmallVectorTemplateCommon<char,_void>.
                                       super_SmallVectorBase._8_8_ & 0xffffffff),__n);
  Str_02.Length = 3;
  Str_02.Data = "s)\n";
  raw_ostream::operator<<(prVar1,Str_02);
  if ((undefined1 *)
      local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_50) {
    free(local_60.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_98.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_88) {
    free(local_98.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void APInt::dump() const {
  SmallString<40> S, U;
  this->toStringUnsigned(U);
  this->toStringSigned(S);
  dbgs() << "APInt(" << BitWidth << "b, "
         << U << "u " << S << "s)\n";
}